

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

void __thiscall QItemSelectionRangeRefCache::populate(QItemSelectionRangeRefCache *this)

{
  int iVar1;
  int *in_RDI;
  
  if (*in_RDI < -1) {
    iVar1 = QItemSelectionRange::top((QItemSelectionRange *)0x83b88c);
    *in_RDI = iVar1;
    iVar1 = QItemSelectionRange::left((QItemSelectionRange *)0x83b89e);
    in_RDI[1] = iVar1;
    iVar1 = QItemSelectionRange::bottom((QItemSelectionRange *)0x83b8b1);
    in_RDI[2] = iVar1;
    iVar1 = QItemSelectionRange::right((QItemSelectionRange *)0x83b8c4);
    in_RDI[3] = iVar1;
  }
  return;
}

Assistant:

inline void populate()
    {
        if (m_top > -2)
            return;
        m_top = m_range.top();
        m_left = m_range.left();
        m_bottom = m_range.bottom();
        m_right = m_range.right();
    }